

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_SetInnerForcing
              (void *arkode_mem,realtype tshift,realtype tscale,N_Vector *forcing,int nvecs)

{
  int iVar1;
  realtype *prVar2;
  N_Vector *pp_Var3;
  size_t __nmemb;
  bool bVar4;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_30;
  ARKodeMem local_28;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"arkStep_SetInnerForcing",&local_28,&local_30);
  if (iVar1 == 0) {
    if (nvecs < 1) {
      iVar1 = 0;
      local_30->expforcing = 0;
      local_30->impforcing = 0;
      *(undefined4 *)&local_30->tshift = 0;
      *(undefined4 *)((long)&local_30->tshift + 4) = 0;
      *(undefined4 *)&local_30->tscale = 0;
      *(undefined4 *)((long)&local_30->tscale + 4) = 0x3ff00000;
      local_30->forcing = (N_Vector *)0x0;
      local_30->nforcing = 0;
    }
    else {
      bVar4 = local_30->explicit == 0;
      local_30->expforcing = (uint)!bVar4;
      local_30->impforcing = (uint)bVar4;
      local_30->tshift = tshift;
      local_30->tscale = tscale;
      local_30->forcing = forcing;
      local_30->nforcing = nvecs;
      iVar1 = 0;
      if (((local_30->cvals != (realtype *)0x0) && (local_30->Xvecs != (N_Vector *)0x0)) &&
         (local_30->nfusedopvecs - nvecs < local_30->stages * 2 + 2)) {
        free(local_30->cvals);
        local_28->lrw = local_28->lrw - (long)local_30->nfusedopvecs;
        if (local_30->Xvecs != (N_Vector *)0x0) {
          free(local_30->Xvecs);
          local_28->liw = local_28->liw - (long)local_30->nfusedopvecs;
        }
        iVar1 = nvecs + local_30->stages * 2 + 2;
        local_30->nfusedopvecs = iVar1;
        local_30->cvals = (realtype *)0x0;
        __nmemb = (size_t)iVar1;
        prVar2 = (realtype *)calloc(__nmemb,8);
        local_30->cvals = prVar2;
        iVar1 = -0x14;
        if (prVar2 != (realtype *)0x0) {
          local_28->lrw = local_28->lrw + __nmemb;
          local_30->Xvecs = (N_Vector *)0x0;
          pp_Var3 = (N_Vector *)calloc(__nmemb,8);
          local_30->Xvecs = pp_Var3;
          if (pp_Var3 != (N_Vector *)0x0) {
            local_28->liw = local_28->liw + __nmemb;
            iVar1 = 0;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_SetInnerForcing(void* arkode_mem, realtype tshift, realtype tscale,
                            N_Vector* forcing, int nvecs)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_SetInnerForcing",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  if (nvecs > 0) {

    /* enable forcing */
    if (step_mem->explicit) {
      step_mem->expforcing = SUNTRUE;
      step_mem->impforcing = SUNFALSE;
    } else {
      step_mem->expforcing = SUNFALSE;
      step_mem->impforcing = SUNTRUE;
    }
    step_mem->tshift   = tshift;
    step_mem->tscale   = tscale;
    step_mem->forcing  = forcing;
    step_mem->nforcing = nvecs;

    /* If cvals and Xvecs are not allocated then arkStep_Init has not been
       called and the number of stages has not been set yet. These arrays will
       be allocated in arkStep_Init and take into account the value of nforcing.
       On subsequent calls will check if enough space has allocated in case
       nforcing has increased since the original allocation. */
    if (step_mem->cvals != NULL && step_mem->Xvecs != NULL) {

      /* check if there are enough reusable arrays for fused operations */
      if ((step_mem->nfusedopvecs - nvecs) < (2 * step_mem->stages + 2)) {

        /* free current work space */
        if (step_mem->cvals != NULL) {
          free(step_mem->cvals);
          ark_mem->lrw -= step_mem->nfusedopvecs;
        }
        if (step_mem->Xvecs != NULL) {
          free(step_mem->Xvecs);
          ark_mem->liw -= step_mem->nfusedopvecs;
        }

        /* allocate reusable arrays for fused vector operations */
        step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + nvecs;

        step_mem->cvals = NULL;
        step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs,
                                              sizeof(realtype));
        if (step_mem->cvals == NULL) return(ARK_MEM_FAIL);
        ark_mem->lrw += step_mem->nfusedopvecs;

        step_mem->Xvecs = NULL;
        step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs,
                                              sizeof(N_Vector));
        if (step_mem->Xvecs == NULL) return(ARK_MEM_FAIL);
        ark_mem->liw += step_mem->nfusedopvecs;
      }
    }

  } else {

    /* disable forcing */
    step_mem->expforcing = SUNFALSE;
    step_mem->impforcing = SUNFALSE;
    step_mem->tshift     = ZERO;
    step_mem->tscale     = ONE;
    step_mem->forcing    = NULL;
    step_mem->nforcing   = 0;

  }

  return(0);
}